

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O2

unsigned_long_long __thiscall
KarpRabinHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  size_type sVar2;
  byte *pbVar3;
  uint j;
  ulong uVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  ulong __n;
  
  uVar6 = 0;
  uVar1 = 0;
  while( true ) {
    __n = (ulong)uVar1;
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar2 <= __n) break;
    uVar4 = 0;
    uVar5 = 1;
    while( true ) {
      sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
      if (sVar2 + ~__n <= uVar4) break;
      uVar5 = uVar5 * 0x25 & *(ulong *)(this + 0x810);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    pbVar3 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,__n);
    uVar6 = (uVar5 * *(long *)(this + (ulong)*pbVar3 * 8 + 0x10) & *(ulong *)(this + 0x810)) + uVar6
            & *(ulong *)(this + 0x810);
    uVar1 = uVar1 + 1;
  }
  return uVar6;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }